

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manual-optimizer.cpp
# Opt level: O2

bool __thiscall manual_course::next(manual_course *this)

{
  int *piVar1;
  ulong uVar2;
  
  uVar2 = (ulong)(uint)this->length;
  piVar1 = (this->iterators)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
           super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
           super__Head_base<0UL,_int_*,_false>._M_head_impl;
  do {
    if ((int)uVar2 < 1) {
LAB_0011b7ea:
      return 0 < (int)uVar2;
    }
    if (piVar1[uVar2 - 1] + 1 < this->length) {
      piVar1[uVar2 - 1] = piVar1[uVar2 - 1] + 1;
      goto LAB_0011b7ea;
    }
    piVar1[uVar2 - 1] = 0;
    uVar2 = uVar2 - 1;
  } while( true );
}

Assistant:

bool next()
    {
        for (int i = length - 1; i >= 0; --i) {
            if (iterators[i] + 1 >= length) {
                iterators[i] = 0;
            } else {
                ++iterators[i];
                return true;
            }
        }

        return false;
    }